

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

int __thiscall
TPZMatrix<float>::AddSub
          (TPZMatrix<float> *this,int64_t sRow,int64_t sCol,int64_t rowSize,int64_t colSize,
          int64_t pRow,int64_t pCol,TPZMatrix<float> *pA)

{
  int64_t r;
  int64_t c;
  int64_t iVar1;
  int64_t col;
  int64_t iVar2;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float local_4c;
  long local_48;
  int64_t local_40;
  long local_38;
  
  local_38 = rowSize + pRow;
  local_48 = sRow;
  local_40 = sCol;
  if (((pA->super_TPZBaseMatrix).fRow < local_38) ||
     ((pA->super_TPZBaseMatrix).fCol < colSize + pCol)) {
    Error("AddSub <the sub-matrix is too big that target>",(char *)0x0);
  }
  while( true ) {
    iVar1 = pCol;
    iVar2 = local_40;
    if (local_38 <= pRow) break;
    for (; iVar1 < colSize + pCol; iVar1 = iVar1 + 1) {
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,local_48,iVar2);
      (*(pA->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(pA,pRow,iVar1);
      local_4c = extraout_XMM0_Da_00 + extraout_XMM0_Da;
      (*(pA->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])(pA,pRow,iVar1,&local_4c);
      iVar2 = iVar2 + 1;
    }
    pRow = pRow + 1;
    local_48 = local_48 + 1;
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::AddSub(const int64_t sRow, const int64_t sCol, const int64_t rowSize,
							const int64_t colSize,const int64_t pRow,const int64_t pCol, TPZMatrix<TVar> *pA ) const {
    if ( ((pRow + rowSize) > pA->Rows()) || ((pCol + colSize) > pA->Cols())) {
        Error( "AddSub <the sub-matrix is too big that target>" );
    }
    int64_t NewRowSize = rowSize+pRow;
    int64_t NewColSize = colSize+pCol;
	
    int64_t row = sRow;
    for ( int64_t r = pRow; r < NewRowSize; r++, row++ ) {
        int64_t col = sCol;
        for ( int64_t c = pCol ; c < NewColSize; c++, col++ ) {
            pA->PutVal( r, c, GetVal( row, col )+pA->GetVal(r,c));
        }
    }
    return( 1 );
}